

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::queue_up(torrent *this)

{
  int iVar1;
  bool bVar2;
  queue_position_t p;
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    bVar2 = is_finished(this);
    if (!bVar2) {
      iVar1 = (this->m_sequence_number).m_val;
      p.m_val = iVar1 + -1;
      if (iVar1 == 0) {
        p.m_val = 0;
      }
      set_queue_position(this,p);
      return;
    }
  }
  return;
}

Assistant:

void torrent::queue_up()
	{
		// finished torrents may not change their queue positions, as it's set to
		// -1
		if (m_abort || is_finished()) return;

		set_queue_position(queue_position() == queue_position_t{0}
			? queue_position() : prev(queue_position()));
	}